

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O1

int beMsgGetListStrings(be_node *n,
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *values)

{
  size_t *psVar1;
  uint uVar2;
  _Node *p_Var3;
  long lVar4;
  be_node *node;
  bool bVar5;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  if (n->type == BE_LIST) {
    node = *(n->val).l;
    bVar5 = node == (be_node *)0x0;
    if ((!bVar5) && (node->type == BE_STR)) {
      lVar4 = 8;
      do {
        be_str_len(node);
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::append((char *)&local_50,(node->val).i);
        p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            values,&local_50);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(values->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        node = *(be_node **)((n->val).s + lVar4);
        bVar5 = node == (be_node *)0x0;
      } while ((!bVar5) && (lVar4 = lVar4 + 8, node->type == BE_STR));
    }
    uVar2 = (uint)bVar5;
  }
  return uVar2;
}

Assistant:

int beMsgGetListStrings(be_node *n, std::list<std::string> &values) {
	if (n->type != BE_LIST) {
		return 0;
	}
	for (int i = 0; n->val.l[i] != NULL; i++) {
		be_node *val = n->val.l[i];

		if (val == NULL || val->type != BE_STR)	
			return 0;

		int len = be_str_len(val);
		std::string str;
		str.append(val->val.s, len);
		values.push_back(str);
	}
        return 1;
}